

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall TPZAnalysis::Print(TPZAnalysis *this,string *name,ostream *out)

{
  ostream *poVar1;
  TPZConnect *this_00;
  TPZBaseMatrix *pTVar2;
  long lVar3;
  long nelem;
  
  poVar1 = std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (this->fCompMesh == (TPZCompMesh *)0x0) {
    std::operator<<(out,"No computational mesh\n");
  }
  else {
    lVar3 = (this->fCompMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
    nelem = 0;
    if (lVar3 < 1) {
      lVar3 = nelem;
    }
    for (; lVar3 != nelem; nelem = nelem + 1) {
      this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&(this->fCompMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                           nelem);
      if (this_00->fSequenceNumber != -1) {
        poVar1 = std::operator<<(out,"Connect index ");
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        std::endl<char,std::char_traits<char>>(poVar1);
        TPZConnect::Print(this_00,this->fCompMesh,out);
      }
    }
  }
  pTVar2 = TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(&this->fSolution);
  (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x1c])(pTVar2,"fSolution",out,0);
  if (this->fCompMesh == (TPZCompMesh *)0x0) {
    return;
  }
  TPZCompMesh::ConnectSolution(this->fCompMesh,out);
  return;
}

Assistant:

void TPZAnalysis::Print( const std::string &name, std::ostream &out) {
	out<<endl<<name<<endl;
    if (!fCompMesh) {
        out << "No computational mesh\n";
    }
    else
    {
        int64_t i,nelements = fCompMesh->ConnectVec().NElements();
        for(i=0;i<nelements;i++) {
            TPZConnect &gnod = fCompMesh->ConnectVec()[i];
            if(gnod.SequenceNumber()!=-1) {
                out << "Connect index " << i << endl;
                gnod.Print(*fCompMesh,out);
            }
        }
    }
    TPZBaseMatrix &sol = this->Solution();
	sol.Print("fSolution",out);
    if (fCompMesh) {
        fCompMesh->ConnectSolution(out);
    }
}